

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O1

reverse_iterator __thiscall JSONNode::rend(JSONNode *this)

{
  internalJSONNode *orig;
  JSONNode **ppJVar1;
  undefined8 *in_RSI;
  
  orig = (internalJSONNode *)*in_RSI;
  if (1 < orig->refcount) {
    orig->refcount = orig->refcount - 1;
    orig = internalJSONNode::newInternal(orig);
  }
  *in_RSI = orig;
  if ((orig->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(orig);
    ppJVar1 = orig->Children->array;
  }
  else {
    ppJVar1 = (JSONNode **)0x0;
  }
  this->internal = (internalJSONNode *)(ppJVar1 + -1);
  return (reverse_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::reverse_iterator JSONNode::rend(void) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("rend"));
		  makeUniqueInternal();
		  return JSONNode::reverse_iterator(internal -> begin() - 1);
	   }